

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O1

void __thiscall QGuiApplicationPrivate::~QGuiApplicationPrivate(QGuiApplicationPrivate *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Data *pDVar1;
  Data *pDVar2;
  QOpenGLContext *pQVar3;
  QList<QObject_*> *ctx;
  QFont *pQVar4;
  ulong uVar5;
  
  *(undefined ***)this = &PTR__QGuiApplicationPrivate_007e4f80;
  QCoreApplicationPrivate::is_app_closing._0_1_ = 1;
  QCoreApplicationPrivate::is_app_running._0_1_ = 0;
  if (generic_plugin_list.d.size != 0) {
    uVar5 = 0;
    do {
      if (generic_plugin_list.d.ptr[uVar5] != (QObject *)0x0) {
        (**(code **)(*(long *)generic_plugin_list.d.ptr[uVar5] + 0x20))();
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)generic_plugin_list.d.size);
  }
  ctx = &generic_plugin_list;
  QList<QObject_*>::clear(&generic_plugin_list);
  pQVar4 = app_font;
  if (app_font != (QFont *)0x0) {
    QFont::~QFont(app_font);
    operator_delete(pQVar4,0x10);
    ctx = (QList<QObject_*> *)pQVar4;
  }
  app_font = (QFont *)0x0;
  QFont::cleanup((EVP_PKEY_CTX *)ctx);
  QCursorData::cleanup((EVP_PKEY_CTX *)ctx);
  layout_direction = LayoutDirectionAuto;
  QCoreApplicationPrivate::cleanupThreadData();
  if (styleHints != (QStyleHints *)0x0) {
    (**(code **)(*(long *)styleHints + 0x20))();
  }
  styleHints = (QStyleHints *)0x0;
  if (this->inputMethod != (QInputMethod *)0x0) {
    (**(code **)(*(long *)this->inputMethod + 0x20))();
  }
  qt_cleanupFontDatabase();
  QPixmapCache::clear();
  if (this->ownGlobalShareContext == true) {
    pQVar3 = qt_gl_global_share_context();
    if (pQVar3 != (QOpenGLContext *)0x0) {
      (**(code **)(*(long *)pQVar3 + 0x20))();
    }
    qt_gl_set_global_share_context((QOpenGLContext *)0x0);
  }
  (*platform_integration->_vptr_QPlatformIntegration[0xc])();
  if (platform_theme != (QPlatformTheme *)0x0) {
    (*platform_theme->_vptr_QPlatformTheme[1])();
  }
  platform_theme = (QPlatformTheme *)0x0;
  if (platform_integration != (QPlatformIntegration *)0x0) {
    (*platform_integration->_vptr_QPlatformIntegration[1])();
  }
  platform_integration = (QPlatformIntegration *)0x0;
  QList<QWindow_*>::clear(&window_list);
  QList<QWindow_*>::clear(&popup_list);
  QList<QScreen_*>::clear(&screen_list);
  self = (QGuiApplicationPrivate *)0x0;
  this_00 = (this->m_a32ColorProfile).super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>::~QHash
            (&this->synthesizedMousePoints);
  QShortcutMap::~QShortcutMap(&this->shortcutMap);
  QIcon::~QIcon(&this->forcedWindowIcon);
  pDVar1 = (this->firstWindowTitle).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->firstWindowTitle).d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QCursor>::~QArrayDataPointer(&(this->cursor_list).d);
  pDVar2 = (this->modalWindowList).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->modalWindowList).d.d)->super_QArrayData,8,0x10);
    }
  }
  QCoreApplicationPrivate::~QCoreApplicationPrivate(&this->super_QCoreApplicationPrivate);
  return;
}

Assistant:

QGuiApplicationPrivate::~QGuiApplicationPrivate()
{
    is_app_closing = true;
    is_app_running = false;

    for (int i = 0; i < generic_plugin_list.size(); ++i)
        delete generic_plugin_list.at(i);
    generic_plugin_list.clear();

    clearFontUnlocked();

    QFont::cleanup();

#ifndef QT_NO_CURSOR
    QCursorData::cleanup();
#endif

    layout_direction = Qt::LayoutDirectionAuto;

    cleanupThreadData();

    delete QGuiApplicationPrivate::styleHints;
    QGuiApplicationPrivate::styleHints = nullptr;
    delete inputMethod;

    qt_cleanupFontDatabase();

    QPixmapCache::clear();

#ifndef QT_NO_OPENGL
    if (ownGlobalShareContext) {
        delete qt_gl_global_share_context();
        qt_gl_set_global_share_context(nullptr);
    }
#endif

#if QT_CONFIG(vulkan)
    QVulkanDefaultInstance::cleanup();
#endif

    platform_integration->destroy();

    delete platform_theme;
    platform_theme = nullptr;
    delete platform_integration;
    platform_integration = nullptr;

    window_list.clear();
    popup_list.clear();
    screen_list.clear();

    self = nullptr;
}